

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileLockPool.cxx
# Opt level: O1

cmFileLockResult __thiscall
cmFileLockPool::ScopePool::Lock(ScopePool *this,string *filename,unsigned_long timeoutSec)

{
  size_t *psVar1;
  bool bVar2;
  cmFileLock *this_00;
  _List_node_base *p_Var3;
  cmFileLockResult result;
  cmFileLockResult local_28;
  
  this_00 = (cmFileLock *)operator_new(0x28);
  cmFileLock::cmFileLock(this_00);
  local_28 = cmFileLock::Lock(this_00,filename,timeoutSec);
  bVar2 = cmFileLockResult::IsOk(&local_28);
  if (bVar2) {
    p_Var3 = (_List_node_base *)operator_new(0x18);
    p_Var3[1]._M_next = (_List_node_base *)this_00;
    std::__detail::_List_node_base::_M_hook(p_Var3);
    psVar1 = &(this->Locks).super__List_base<cmFileLock_*,_std::allocator<cmFileLock_*>_>._M_impl.
              _M_node._M_size;
    *psVar1 = *psVar1 + 1;
    local_28 = cmFileLockResult::MakeOk();
  }
  else {
    cmFileLock::~cmFileLock(this_00);
    operator_delete(this_00,0x28);
  }
  return local_28;
}

Assistant:

cmFileLockResult cmFileLockPool::ScopePool::Lock(
    const std::string& filename, unsigned long timeoutSec)
{
  cmFileLock *lock = new cmFileLock();
  const cmFileLockResult result = lock->Lock(filename, timeoutSec);
  if (result.IsOk())
    {
    this->Locks.push_back(lock);
    return cmFileLockResult::MakeOk();
    }
  else
    {
    delete lock;
    return result;
    }
}